

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

bool bssl::dtls1_get_message(SSL *ssl,SSLMessage *out)

{
  uint8_t *puVar1;
  SSLMessage *this;
  bool bVar2;
  size_t in_R9;
  Span<const_unsigned_char> SVar3;
  Span<const_unsigned_char> SVar4;
  uchar *local_78;
  cbs_st local_60;
  Span<const_unsigned_char> local_50;
  cbs_st local_40;
  pointer local_30;
  DTLSIncomingMessage *frag;
  size_t idx;
  SSLMessage *out_local;
  SSL *ssl_local;
  
  idx = (size_t)out;
  out_local = (SSLMessage *)ssl;
  bVar2 = dtls1_is_current_message_complete(ssl);
  if (bVar2) {
    frag = (DTLSIncomingMessage *)(long)(int)((uint)*(ushort *)(out_local[1].body.len + 4) % 7);
    local_30 = std::unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::get
                         ((unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter> *)
                          (out_local[1].body.len + 0x118 + (long)frag * 8));
    *(uint8_t *)(idx + 1) = local_30->type;
    Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
              ((Span<unsigned_char_const> *)&local_50,&local_30->data);
    cbs_st::cbs_st(&local_40,local_50);
    *(uint8_t **)(idx + 0x18) = local_40.data;
    *(size_t *)(idx + 0x20) = local_40.len;
    SVar3 = DTLSIncomingMessage::msg(local_30);
    cbs_st::cbs_st(&local_60,SVar3);
    this = out_local;
    *(uint8_t **)(idx + 8) = local_60.data;
    *(size_t *)(idx + 0x10) = local_60.len;
    *(undefined1 *)idx = 0;
    if ((*(ushort *)(out_local[1].body.data + 0xdc) >> 3 & 1) == 0) {
      SVar4 = cbs_st::operator_cast_to_Span((cbs_st *)(idx + 0x18));
      local_78 = (uchar *)SVar4.size_;
      SVar3.size_ = in_R9;
      SVar3.data_ = local_78;
      ssl_do_msg_callback((bssl *)this,(SSL *)0x0,0x16,(int)SVar4.data_,SVar3);
      puVar1 = out_local[1].body.data;
      *(ushort *)(puVar1 + 0xdc) = *(ushort *)(puVar1 + 0xdc) & 0xfff7 | 8;
    }
    ssl_local._7_1_ = true;
  }
  else {
    ssl_local._7_1_ = false;
  }
  return ssl_local._7_1_;
}

Assistant:

bool dtls1_get_message(const SSL *ssl, SSLMessage *out) {
  if (!dtls1_is_current_message_complete(ssl)) {
    return false;
  }

  size_t idx = ssl->d1->handshake_read_seq % SSL_MAX_HANDSHAKE_FLIGHT;
  const DTLSIncomingMessage *frag = ssl->d1->incoming_messages[idx].get();
  out->type = frag->type;
  out->raw = CBS(frag->data);
  out->body = CBS(frag->msg());
  out->is_v2_hello = false;
  if (!ssl->s3->has_message) {
    ssl_do_msg_callback(ssl, 0 /* read */, SSL3_RT_HANDSHAKE, out->raw);
    ssl->s3->has_message = true;
  }
  return true;
}